

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O2

void __thiscall
ADE_DEP_DPFSP::LS1EXC
          (ADE_DEP_DPFSP *this,Permutazione *p,uint iF,int *indiciFabbriche,uint *cFabbriche)

{
  unsigned_short uVar1;
  int iVar2;
  unsigned_short *puVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *risultato;
  bool bVar6;
  ulong uVar7;
  ushort uVar8;
  ushort d;
  uint uVar9;
  ushort uVar10;
  ulong uVar11;
  ushort local_9a;
  ushort local_98;
  IndiciRandom indRand;
  
  uVar9 = (indiciFabbriche[iF + 1] - indiciFabbriche[iF]) + 1;
  uVar4 = Random::randIntU(&genRand,2,0x32);
  d = (ushort)uVar9;
  if (d < (ushort)uVar4) {
    uVar4 = uVar9;
  }
  uVar9 = uVar4 & 0xffff;
  risultato = (unsigned_short *)operator_new__((ulong)(uVar9 * 2));
  IndiciRandom::IndiciRandom(&indRand,&genRand,d);
  IndiciRandom::generaIndici(&indRand,risultato,(unsigned_short)uVar4);
  uVar4 = (uint)(ushort)cFabbriche[iF >> 1];
  bVar6 = false;
  for (uVar7 = 0; uVar11 = uVar7 & 0xffff, (int)uVar11 < (int)(uVar9 - 1);
      uVar7 = (ulong)((int)uVar7 + 1)) {
    uVar8 = risultato[uVar11] + (short)indiciFabbriche[iF];
    while (uVar11 = uVar11 + 1, uVar11 < uVar9) {
      iVar2 = indiciFabbriche[iF];
      uVar10 = risultato[uVar11] + (short)iVar2;
      puVar3 = p->individuo;
      uVar1 = puVar3[uVar8];
      puVar3[uVar8] = puVar3[uVar10];
      puVar3[uVar10] = uVar1;
      uVar5 = valutaIndividuoParziale(this,puVar3 + iVar2,d);
      if ((uVar5 & 0xffff) < (uVar4 & 0xffff)) {
        bVar6 = true;
        uVar4 = uVar5;
        local_9a = uVar8;
        local_98 = uVar10;
      }
      puVar3 = p->individuo;
      uVar1 = puVar3[uVar8];
      puVar3[uVar8] = puVar3[uVar10];
      puVar3[uVar10] = uVar1;
    }
  }
  if (bVar6) {
    puVar3 = p->individuo;
    uVar1 = puVar3[local_9a];
    puVar3[local_9a] = puVar3[local_98];
    puVar3[local_98] = uVar1;
    cFabbriche[iF >> 1] = uVar4 & 0xffff;
  }
  operator_delete__(risultato);
  IndiciRandom::~IndiciRandom(&indRand);
  return;
}

Assistant:

void ADE_DEP_DPFSP::LS1EXC(Permutazione* p, unsigned int iF, int* indiciFabbriche, unsigned int* cFabbriche) {
	
	unsigned short dimensioneFabbrica = indiciFabbriche[iF + 1] - indiciFabbriche[iF] + 1;

	unsigned short  posizioniDaSelezionare = min(dimensioneFabbrica, (unsigned short)genRand.randIntU(2, 50));

	unsigned short* indici = new unsigned short[posizioniDaSelezionare];
	
	IndiciRandom indRand(&genRand, dimensioneFabbrica);

	indRand.generaIndici(indici, posizioniDaSelezionare);

	bool miglioramento = false;
	unsigned short miglioreIndice1, miglioreIndice2, nuovoCosto, miglioreCosto = cFabbriche[iF / 2],
		indice1, indice2, tmp;

	for (unsigned short i = 0; i < posizioniDaSelezionare - 1; i++) {
		indice1 = indiciFabbriche[iF] + indici[i];

		for (unsigned short j = i + 1; j < posizioniDaSelezionare; j++) {
			indice2 = indiciFabbriche[iF] + indici[j];

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;

			nuovoCosto = valutaIndividuoParziale(&p->individuo[indiciFabbriche[iF]], dimensioneFabbrica);
			if (nuovoCosto < miglioreCosto) {
				miglioreCosto = nuovoCosto;
				miglioreIndice1 = indice1;
				miglioreIndice2 = indice2;
				miglioramento = true;
			}

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;
		}
	}

	if (miglioramento) {
		tmp = p->individuo[miglioreIndice1];
		p->individuo[miglioreIndice1] = p->individuo[miglioreIndice2];
		p->individuo[miglioreIndice2] = tmp;

		cFabbriche[iF / 2] = miglioreCosto;
	}

	delete[] indici;
}